

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void google::protobuf::internal::
     arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
               (void *object)

{
  if (*(long **)((long)object + 8) != (long *)((long)object + 0x18)) {
    operator_delete(*(long **)((long)object + 8),*(long *)((long)object + 0x18) + 1);
    return;
  }
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}